

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checkbox.cpp
# Opt level: O1

void __thiscall cursespp::Checkbox::~Checkbox(Checkbox *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TextLabel).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__Checkbox_001a6ac0;
  (this->super_TextLabel).super_Window.super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__Checkbox_001a6ce0;
  (this->super_TextLabel).super_Window.super_IWindow.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__Checkbox_001a6d10;
  (this->super_TextLabel).super_Window.super_IWindow.super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__Checkbox_001a6d38;
  (this->super_TextLabel).super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__Checkbox_001a6d60;
  pcVar2 = (this->originalText)._M_dataplus._M_p;
  paVar1 = &(this->originalText).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->CheckChanged).
  super__signal_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>.
  super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__signal2_001a6e78;
  sigslot::_signal_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>::~_signal_base2
            (&(this->CheckChanged).
              super__signal_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>);
  TextLabel::~TextLabel(&this->super_TextLabel);
  return;
}

Assistant:

Checkbox::~Checkbox() {
}